

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_7f26b::PedestrianPlugIn::redraw
          (PedestrianPlugIn *this,float currentTime,float elapsedTime)

{
  uint *puVar1;
  Pedestrian *pPVar2;
  AbstractVehicle *selected;
  int iVar3;
  AbstractVehicle *vehicle;
  PolylineSegmentedPathwaySingleRadius *pPVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  Color *color;
  char *pcVar6;
  pointer ppPVar7;
  ulong uVar8;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec3 VVar12;
  Vec3 local_200;
  Vec3 local_1f0;
  Color textColor;
  Vec3 local_1c8;
  undefined1 local_1b8 [16];
  ostringstream status;
  float local_1a0 [4];
  uint auStack_190 [88];
  
  selected = OpenSteer::OpenSteerDemo::selectedVehicle;
  vehicle = OpenSteer::OpenSteerDemo::vehicleNearestToMouse();
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,selected);
  if (OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) {
    (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(selected);
    (this->gridCenter).x = (float)extraout_XMM0_Da;
    (this->gridCenter).y = (float)extraout_XMM0_Db;
    (this->gridCenter).z = elapsedTime;
  }
  OpenSteer::OpenSteerDemo::gridUtility(&this->gridCenter);
  for (ppPVar7 = (this->crowd).
                 super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar7 !=
      (this->crowd).
      super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppPVar7 = ppPVar7 + 1) {
    pPVar2 = *ppPVar7;
    OpenSteer::drawBasic2dCircularVehicle((AbstractVehicle *)pPVar2,(Color *)OpenSteer::gGray50);
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
              ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pPVar2);
  }
  uVar8 = 1;
  pPVar4 = getTestPath();
  while( true ) {
    iVar3 = (*(pPVar4->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])(pPVar4);
    if (CONCAT44(extraout_var,iVar3) <= uVar8) break;
    (*(pPVar4->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar4,uVar8);
    local_1a0[0] = elapsedTime;
    (*(pPVar4->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar4,uVar8 - 1);
    textColor.b_ = elapsedTime;
    OpenSteer::drawLine((Vec3 *)&status,(Vec3 *)&textColor,(Color *)OpenSteer::gRed);
    uVar8 = uVar8 + 1;
  }
  OpenSteer::drawXZCircle
            ((float)(anonymous_namespace)::gObstacle1._12_4_,
             (Vec3 *)((anonymous_namespace)::gObstacle1 + 0x10),(Color *)OpenSteer::gWhite,0x28);
  OpenSteer::drawXZCircle
            ((float)(anonymous_namespace)::gObstacle2._12_4_,
             (Vec3 *)((anonymous_namespace)::gObstacle2 + 0x10),(Color *)OpenSteer::gWhite,0x28);
  fVar11 = (float)(anonymous_namespace)::gObstacle3._60_4_ * 0.5;
  local_1b8 = ZEXT416((uint)fVar11);
  fVar9 = fVar11 * (float)(anonymous_namespace)::gObstacle3._12_8_;
  fVar10 = fVar11 * SUB84((anonymous_namespace)::gObstacle3._12_8_,4);
  local_1a0[0] = (float)(anonymous_namespace)::gObstacle3._56_4_ +
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar11;
  unique0x1000038a = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + fVar10;
  _status = (float)(anonymous_namespace)::gObstacle3._48_8_ + fVar9;
  textColor.b_ = (float)(anonymous_namespace)::gObstacle3._56_4_ -
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar11;
  textColor.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) - fVar10;
  textColor.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ - fVar9;
  OpenSteer::drawLine((Vec3 *)&status,(Vec3 *)&textColor,(Color *)OpenSteer::gWhite);
  textColor.g_ = (float)local_1b8._0_4_;
  textColor.r_ = (float)local_1b8._0_4_;
  textColor.b_ = 0.0;
  VVar12 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizePosition
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      (Vec3 *)&textColor);
  local_1a0[0] = VVar12.z;
  _status = VVar12._0_8_;
  local_1f0._0_8_ = CONCAT44(local_1b8._0_4_,fVar11) ^ 0x80000000;
  local_1f0.z = 0.0;
  VVar12 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizePosition
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_1f0);
  textColor.b_ = VVar12.z;
  textColor._0_8_ = VVar12._0_8_;
  local_200._0_8_ = CONCAT44(fVar11,fVar11) ^ 0x8000000080000000;
  local_200.z = 0.0;
  VVar12 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizePosition
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_200);
  local_1f0.z = VVar12.z;
  local_1f0._0_8_ = VVar12._0_8_;
  local_1c8._0_8_ = CONCAT44(fVar11,local_1b8._0_4_) ^ 0x8000000000000000;
  local_1c8.z = 0.0;
  VVar12 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizePosition
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_1c8);
  fVar9 = VVar12.z;
  local_200._0_8_ = VVar12._0_8_;
  local_200.z = fVar9;
  OpenSteer::drawLine((Vec3 *)&status,(Vec3 *)&textColor,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine((Vec3 *)&textColor,&local_1f0,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_1f0,&local_200,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_200,(Vec3 *)&status,(Color *)OpenSteer::gWhite);
  OpenSteer::OpenSteerDemo::highlightVehicleUtility(vehicle);
  if (OpenSteer::enableAnnotation == '\x01') {
    for (ppPVar7 = (this->crowd).
                   super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar7 !=
        (this->crowd).
        super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar7 = ppPVar7 + 1) {
      pPVar2 = *ppPVar7;
      (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
      local_1f0.y = extraout_XMM0_Db_00;
      local_1f0.x = extraout_XMM0_Da_00;
      local_200.x = 0.0;
      local_200.y = 0.0;
      local_200.z = 0.0;
      local_1f0.z = fVar9;
      if (vehicle != (AbstractVehicle *)0x0) {
        (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(vehicle);
        local_200.y = extraout_XMM0_Db_01;
        local_200.x = extraout_XMM0_Da_01;
        local_200.z = fVar9;
      }
      (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
      _status = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      local_1a0[0] = fVar9;
      fVar9 = OpenSteer::Vec3::distance(&local_1f0,(Vec3 *)&status);
      if (fVar9 < 6.0) {
LAB_00126113:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&status);
        poVar5 = std::operator<<((ostream *)&status,"#");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,*(int *)&(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
                                            field_0x94);
        std::ends<char,std::char_traits<char>>(poVar5);
        fVar9 = 1.0;
        OpenSteer::Color::Color(&textColor,0.8,1.0,0.8,1.0);
        (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
          super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
          super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
        local_1c8.z = fVar9 + 0.0;
        local_1c8._0_8_ = CONCAT44(extraout_XMM0_Db_03 + 0.25,extraout_XMM0_Da_03 + 0.0);
        fVar10 = OpenSteer::drawGetWindowWidth();
        fVar9 = OpenSteer::drawGetWindowHeight();
        OpenSteer::draw2dTextAt3dLocation(&status,&local_1c8,&textColor,fVar10,fVar9);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&status);
      }
      else {
        fVar10 = OpenSteer::Vec3::distance(&local_1f0,&local_200);
        fVar9 = 6.0;
        if (fVar10 < 6.0) goto LAB_00126113;
      }
    }
  }
  if ((OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) &&
     (OpenSteer::enableAnnotation == '\x01')) {
    fVar9 = 0.8;
    OpenSteer::Color::Color(&textColor,0.8,0.8,1.0,1.0);
    (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(selected);
    local_1f0.z = fVar9 + 0.0;
    local_1f0.y = extraout_XMM0_Db_04 + 0.25;
    local_1f0.x = extraout_XMM0_Da_04 + 0.0;
    local_200.x = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.x;
    local_200.y = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.y;
    local_200.z = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.z;
    fVar9 = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.z;
    (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(selected);
    _status = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
    local_1a0[0] = fVar9;
    fVar9 = OpenSteer::Vec3::distance((Vec3 *)&status,&local_200);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&status);
    *(undefined8 *)((long)local_1a0 + *(long *)(_status + -0x18)) = 2;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_status + -0x18));
    *puVar1 = *puVar1 | 4;
    poVar5 = std::operator<<((ostream *)&status,"      ");
    poVar5 = std::operator<<(poVar5,"1: speed: ");
    (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x1b])(selected);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,extraout_XMM0_Da_06);
    std::endl<char,std::char_traits<char>>(poVar5);
    *(undefined8 *)((long)local_1a0 + *(long *)(_status + -0x18)) = 1;
    poVar5 = std::operator<<((ostream *)&status,"      ");
    poVar5 = std::operator<<(poVar5,"2: cam dist: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&status,"      ");
    poVar5 = std::operator<<(poVar5,"3: no third thing");
    std::ends<char,std::char_traits<char>>(poVar5);
    fVar9 = OpenSteer::drawGetWindowWidth();
    fVar10 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dTextAt3dLocation(&status,&local_1f0,&textColor,fVar9,fVar10);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&status);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&status);
  poVar5 = std::operator<<((ostream *)&status,"[F1/F2] Crowd size: ");
  std::ostream::operator<<(poVar5,this->population);
  std::operator<<((ostream *)&status,"\n[F3] PD type: ");
  if (this->cyclePD == 0) {
    pcVar6 = "LQ bin lattice";
  }
  else {
    if (this->cyclePD != 1) goto LAB_001263fe;
    pcVar6 = "brute force";
  }
  std::operator<<((ostream *)&status,pcVar6);
LAB_001263fe:
  std::operator<<((ostream *)&status,"\n[F4] ");
  pcVar6 = "Stay on the path.";
  if ((anonymous_namespace)::gUseDirectedPathFollowing != '\0') {
    pcVar6 = "Directed path following.";
  }
  std::operator<<((ostream *)&status,pcVar6);
  std::operator<<((ostream *)&status,"\n[F5] Wander: ");
  pcVar6 = "no";
  if ((anonymous_namespace)::gWanderSwitch != '\0') {
    pcVar6 = "yes";
  }
  std::operator<<((ostream *)&status,pcVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&status);
  fVar9 = OpenSteer::drawGetWindowHeight();
  fVar10 = OpenSteer::drawGetWindowWidth();
  fVar11 = OpenSteer::drawGetWindowHeight();
  VVar12.y = fVar9 + -50.0;
  VVar12.x = 10.0;
  VVar12.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)&status,(ostringstream *)OpenSteer::gGray80,VVar12,color,fVar10,fVar11);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&status);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
    {
        // selected Pedestrian (user can mouse click to select another)
        AbstractVehicle* selected = OpenSteerDemo::selectedVehicle;
        
        // Pedestrian nearest mouse (to be highlighted)
        AbstractVehicle* nearMouse = OpenSteerDemo::vehicleNearestToMouse ();
        
        // update camera
        OpenSteerDemo::updateCamera (currentTime, elapsedTime, selected);
        
        // draw "ground plane"
        if (OpenSteerDemo::selectedVehicle) gridCenter = selected->position();
        OpenSteerDemo::gridUtility (gridCenter);
        
        // draw and annotate each Pedestrian
        for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).draw (); 
        
        // draw the path they follow and obstacles they avoid
        drawPathAndObstacles ();
        
        // highlight Pedestrian nearest mouse
        OpenSteerDemo::highlightVehicleUtility (nearMouse);
        
        // textual annotation (at the vehicle's screen position)
        serialNumberAnnotationUtility (selected, nearMouse);
        
        // textual annotation for selected Pedestrian
        if (OpenSteerDemo::selectedVehicle && OpenSteer::annotationIsOn())
        {
            const Color color (0.8f, 0.8f, 1.0f);
            const Vec3 textOffset (0, 0.25f, 0);
            const Vec3 textPosition = selected->position() + textOffset;
            const Vec3 camPosition = OpenSteerDemo::camera.position();
            const float camDistance = Vec3::distance (selected->position(),
                                                      camPosition);
            const char* spacer = "      ";
            std::ostringstream annote;
            annote << std::setprecision (2);
            annote << std::setiosflags (std::ios::fixed);
            annote << spacer << "1: speed: " << selected->speed() << std::endl;
            annote << std::setprecision (1);
            annote << spacer << "2: cam dist: " << camDistance << std::endl;
            annote << spacer << "3: no third thing" << std::ends;
            draw2dTextAt3dLocation (annote, textPosition, color, drawGetWindowWidth(), drawGetWindowHeight());
        }
        
        // display status in the upper left corner of the window
        std::ostringstream status;
        status << "[F1/F2] Crowd size: " << population;
        status << "\n[F3] PD type: ";
        switch (cyclePD)
        {
            case 0: status << "LQ bin lattice"; break;
            case 1: status << "brute force";    break;
        }
        status << "\n[F4] ";
        if (gUseDirectedPathFollowing)
            status << "Directed path following.";
        else
            status << "Stay on the path.";
        status << "\n[F5] Wander: ";
        if (gWanderSwitch) status << "yes"; else status << "no";
        status << std::endl;
        const float h = drawGetWindowHeight ();
        const Vec3 screenLocation (10, h-50, 0);
        draw2dTextAt2dLocation (status, screenLocation, gGray80, drawGetWindowWidth(), drawGetWindowHeight());
    }